

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryMul<Fad<Fad<double>_>,_FadCst<int>_> *this,
          int i)

{
  int iVar1;
  Fad<Fad<double>_> *pFVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  Fad<double> *pFVar7;
  double dVar8;
  
  pFVar2 = this->left_;
  pFVar7 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pFVar7 = (pFVar2->dx_).ptr_to_data + i;
  }
  dVar8 = (double)(this->right_).constant_;
  __return_storage_ptr__->val_ = pFVar7->val_ * dVar8;
  iVar1 = (pFVar7->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((long)iVar1 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = iVar1;
    pdVar4 = (double *)operator_new__((long)iVar1 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    lVar5 = (long)(pFVar7->dx_).num_elts;
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < lVar5) {
      pdVar3 = (pFVar7->dx_).ptr_to_data;
      lVar6 = 0;
      do {
        pdVar4[lVar6] = pdVar3[lVar6] * dVar8;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val();}